

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<signed_char>::
Generators<Catch::Generators::GeneratorWrapper<signed_char>,int,signed_char,signed_char,int>
          (Generators<signed_char> *this,GeneratorWrapper<signed_char> *moreGenerators,
          int *moreGenerators_1,char *moreGenerators_2,char *moreGenerators_3,int *moreGenerators_4)

{
  (this->super_IGenerator<signed_char>).super_GeneratorUntypedBase.m_stringReprCache._M_dataplus.
  _M_p = (pointer)&(this->super_IGenerator<signed_char>).super_GeneratorUntypedBase.
                   m_stringReprCache.field_2;
  (this->super_IGenerator<signed_char>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_string_length = 0;
  (this->super_IGenerator<signed_char>).super_GeneratorUntypedBase.m_stringReprCache.field_2.
  _M_local_buf[0] = '\0';
  (this->super_IGenerator<signed_char>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<signed_char>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_003cc130;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
  ::reserve(&this->m_generators,5);
  add_generators<Catch::Generators::GeneratorWrapper<signed_char>,int,signed_char,signed_char,int>
            (this,moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3,moreGenerators_4
            );
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }